

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O1

void yaml_emitter_delete_document_and_anchors(yaml_emitter_t *emitter)

{
  yaml_node_t *pyVar1;
  yaml_node_type_t yVar2;
  yaml_document_t *pyVar3;
  yaml_node_t *pyVar4;
  yaml_node_t *ptr;
  long lVar5;
  long lVar6;
  yaml_char_t *ptr_00;
  
  pyVar3 = emitter->document;
  if (emitter->anchors == (yaml_anchors_t *)0x0) {
    yaml_document_delete(pyVar3);
  }
  else {
    pyVar4 = (pyVar3->nodes).start;
    ptr = pyVar4;
    if (pyVar4 < (pyVar3->nodes).top) {
      lVar5 = 8;
      lVar6 = 0x60;
      do {
        yVar2 = pyVar4->type;
        ptr_00 = (pyVar4->data).scalar.value;
        if (*(int *)((long)&emitter->anchors->references + lVar5) == 0) {
          yaml_free(pyVar4->tag);
          if (yVar2 == YAML_SEQUENCE_NODE) goto LAB_00105467;
          if (yVar2 == YAML_SCALAR_NODE) {
            yaml_free(ptr_00);
            goto LAB_00105443;
          }
        }
        else {
LAB_00105443:
          if (yVar2 == YAML_SEQUENCE_NODE) {
LAB_00105467:
            yaml_free(ptr_00);
            ptr_00 = (yaml_char_t *)0x0;
          }
        }
        if (yVar2 == YAML_MAPPING_NODE) {
          yaml_free(ptr_00);
        }
        pyVar3 = emitter->document;
        ptr = (pyVar3->nodes).start;
        pyVar4 = (yaml_node_t *)((long)&ptr->type + lVar6);
        lVar5 = lVar5 + 0xc;
        pyVar1 = (yaml_node_t *)((long)&ptr->type + lVar6);
        lVar6 = lVar6 + 0x60;
      } while (pyVar1 < (pyVar3->nodes).top);
    }
    yaml_free(ptr);
    pyVar3 = emitter->document;
    (pyVar3->nodes).top = (yaml_node_t *)0x0;
    (pyVar3->nodes).start = (yaml_node_t *)0x0;
    (pyVar3->nodes).end = (yaml_node_t *)0x0;
    yaml_free(emitter->anchors);
    emitter->anchors = (yaml_anchors_t *)0x0;
    emitter->last_anchor_id = 0;
  }
  emitter->document = (yaml_document_t *)0x0;
  return;
}

Assistant:

static void
yaml_emitter_delete_document_and_anchors(yaml_emitter_t *emitter)
{
    int index;

    if (!emitter->anchors) {
        yaml_document_delete(emitter->document);
        emitter->document = NULL;
        return;
    }

    for (index = 0; emitter->document->nodes.start + index
            < emitter->document->nodes.top; index ++) {
        yaml_node_t node = emitter->document->nodes.start[index];
        if (!emitter->anchors[index].serialized) {
            yaml_free(node.tag);
            if (node.type == YAML_SCALAR_NODE) {
                yaml_free(node.data.scalar.value);
            }
        }
        if (node.type == YAML_SEQUENCE_NODE) {
            STACK_DEL(emitter, node.data.sequence.items);
        }
        if (node.type == YAML_MAPPING_NODE) {
            STACK_DEL(emitter, node.data.mapping.pairs);
        }
    }

    STACK_DEL(emitter, emitter->document->nodes);
    yaml_free(emitter->anchors);

    emitter->anchors = NULL;
    emitter->last_anchor_id = 0;
    emitter->document = NULL;
}